

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * allocate_symbol_pseudo(Proc *proc,LuaSymbol *sym,uint reg)

{
  C_MemoryAllocator *pCVar1;
  Pseudo *pPVar2;
  Pseudo *pseudo;
  C_MemoryAllocator *allocator;
  uint reg_local;
  LuaSymbol *sym_local;
  Proc *proc_local;
  
  pCVar1 = proc->linearizer->compiler_state->allocator;
  pPVar2 = (Pseudo *)(*pCVar1->calloc)(pCVar1->arena,1,0x30);
  *(uint *)pPVar2 = *(uint *)pPVar2 & 0xfffffff0;
  (pPVar2->field_3).symbol = sym;
  *(uint *)pPVar2 = *(uint *)pPVar2 & 0xfff0000f | (reg & 0xffff) << 4;
  if (sym->symbol_type == SYM_LOCAL) {
    if ((sym->field_1).variable.pseudo != (Pseudo *)0x0) {
      __assert_fail("sym->variable.pseudo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0x1c8,"Pseudo *allocate_symbol_pseudo(Proc *, LuaSymbol *, unsigned int)");
    }
    (sym->field_1).variable.pseudo = pPVar2;
  }
  return pPVar2;
}

Assistant:

static Pseudo *allocate_symbol_pseudo(Proc *proc, LuaSymbol *sym, unsigned reg)
{
	C_MemoryAllocator *allocator = proc->linearizer->compiler_state->allocator;
	Pseudo *pseudo = (Pseudo *) allocator->calloc(allocator->arena, 1, sizeof(Pseudo));
	pseudo->type = PSEUDO_SYMBOL;
	pseudo->symbol = sym;
	pseudo->regnum = reg;
	if (sym->symbol_type == SYM_LOCAL) {
		assert(sym->variable.pseudo == NULL);
		sym->variable.pseudo = pseudo;
	}
	return pseudo;
}